

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator=(Matrix *this,Matrix *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  Matrix *other_local;
  Matrix *this_local;
  
  if (this != other) {
    this->rows = other->rows;
    this->cols = other->cols;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->rows * this->cols);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    this->data = pdVar3;
    std::copy<double*,double*>(other->data,other->data + this->rows * this->cols,this->data);
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& other)
{
    if (this == &other)
        return *this;

    rows = other.rows;
    cols = other.cols;

    data = new double[rows * cols];
    std::copy(other.data, other.data + rows * cols, data);

    return *this;
}